

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx512vbmi_harley_seal(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [32];
  size_t i;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 (*pauVar5) [64];
  ulong uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar39 [16];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar40 [64];
  undefined1 in_ZMM28 [64];
  uint16_t buffer [32];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  if ((len & 0x1ff) != 0) {
    auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar13 = vpmovsxbd_avx512f(_DAT_00116080);
    auVar14 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar4 = (ulong)(len & 0xfffffe00);
    do {
      uVar4 = uVar4 + 1;
      auVar15 = vpbroadcastd_avx512f();
      auVar15 = vpsrlvd_avx512f(auVar15,auVar13);
      auVar15 = vpandd_avx512f(auVar15,auVar14);
      auVar12 = vpaddd_avx512f(auVar15,auVar12);
    } while (uVar4 < len);
    auVar12 = vmovdqu64_avx512f(auVar12);
    *(undefined1 (*) [64])flags = auVar12;
  }
  uVar7 = len >> 5 & 0xfffffff0;
  uVar4 = (ulong)uVar7;
  auVar10 = in_ZMM22._0_16_;
  auVar39 = in_ZMM25._0_16_;
  auVar9 = in_ZMM21._0_16_;
  auVar8 = in_ZMM28._0_16_;
  if (uVar7 == 0) {
    auVar10 = vpxord_avx512vl(auVar10,auVar10);
    auVar14 = ZEXT1664(auVar10);
    auVar10 = vpxord_avx512vl(auVar39,auVar39);
    auVar12 = ZEXT1664(auVar10);
    auVar9 = vpxord_avx512vl(auVar9,auVar9);
    auVar13 = ZEXT1664(auVar9);
    auVar9 = vpxord_avx512vl(auVar8,auVar8);
    auVar15 = ZEXT1664(auVar9);
  }
  else {
    auVar8 = vpxord_avx512vl(auVar8,auVar8);
    auVar15 = ZEXT1664(auVar8);
    auVar8 = vpxord_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
    auVar40 = ZEXT1664(auVar8);
    auVar9 = vpxord_avx512vl(auVar9,auVar9);
    auVar13 = ZEXT1664(auVar9);
    auVar9 = vpxord_avx512vl(auVar39,auVar39);
    auVar12 = ZEXT1664(auVar9);
    auVar9 = vpxord_avx512vl(auVar10,auVar10);
    auVar14 = ZEXT1664(auVar9);
    uVar6 = 0;
    do {
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar40 = vmovdqa64_avx512f(auVar40);
      auVar12 = vmovdqa64_avx512f(auVar12);
      memset(&local_440,0,0x3c0);
      uVar3 = uVar6 + 0xffff;
      if (uVar4 - uVar6 < 0x10000) {
        uVar3 = uVar4;
      }
      if (uVar6 < uVar3) {
        auVar12 = vmovdqa64_avx512f(auVar12);
        auVar16 = vpbroadcastw_avx512bw(ZEXT216(1));
        auVar40 = vmovdqa64_avx512f(auVar40);
        auVar13 = vmovdqa64_avx512f(auVar13);
        auVar14 = vmovdqa64_avx512f(auVar14);
        auVar15 = vmovdqa64_avx512f(auVar15);
        auVar24 = ZEXT1664((undefined1  [16])0x0);
        auVar25 = ZEXT1664((undefined1  [16])0x0);
        auVar26 = ZEXT1664((undefined1  [16])0x0);
        auVar27 = ZEXT1664((undefined1  [16])0x0);
        auVar28 = ZEXT1664((undefined1  [16])0x0);
        auVar29 = ZEXT1664((undefined1  [16])0x0);
        auVar30 = ZEXT1664((undefined1  [16])0x0);
        auVar31 = ZEXT1664((undefined1  [16])0x0);
        auVar32 = ZEXT1664((undefined1  [16])0x0);
        auVar33 = ZEXT1664((undefined1  [16])0x0);
        auVar34 = ZEXT1664((undefined1  [16])0x0);
        auVar35 = ZEXT1664((undefined1  [16])0x0);
        auVar36 = ZEXT1664((undefined1  [16])0x0);
        auVar37 = ZEXT1664((undefined1  [16])0x0);
        auVar38 = ZEXT1664((undefined1  [16])0x0);
        auVar23 = ZEXT1664((undefined1  [16])0x0);
        pauVar5 = (undefined1 (*) [64])(array + uVar6 * 0x20 + 0x1e0);
        do {
          auVar17 = vmovdqu64_avx512f(pauVar5[-0xf]);
          auVar18 = vmovdqu64_avx512f(pauVar5[-0xe]);
          auVar19 = vmovdqu64_avx512f(pauVar5[-0xd]);
          auVar20 = vmovdqu64_avx512f(pauVar5[-0xc]);
          auVar13 = vmovdqa64_avx512f(auVar13);
          auVar21 = vmovdqu64_avx512f(pauVar5[-7]);
          uVar6 = uVar6 + 0x10;
          auVar22 = vmovdqa64_avx512f(auVar18);
          auVar18 = vpternlogd_avx512f(auVar18,auVar17,auVar15,0x96);
          auVar15 = vpternlogd_avx512f(auVar22,auVar17,auVar15,0xe8);
          auVar17 = vmovdqa64_avx512f(auVar20);
          auVar17 = vpternlogd_avx512f(auVar17,auVar19,auVar18,0xe8);
          auVar18 = vpternlogd_avx512f(auVar18,auVar19,auVar20,0x96);
          auVar19 = vmovdqu64_avx512f(pauVar5[-0xb]);
          auVar20 = vmovdqa64_avx512f(auVar17);
          auVar20 = vpternlogd_avx512f(auVar20,auVar15,auVar14,0xe8);
          auVar14 = vpternlogd_avx512f(auVar17,auVar15,auVar14,0x96);
          auVar15 = vmovdqu64_avx512f(pauVar5[-10]);
          auVar17 = vmovdqa64_avx512f(auVar15);
          auVar17 = vpternlogd_avx512f(auVar17,auVar19,auVar18,0xe8);
          auVar15 = vpternlogd_avx512f(auVar18,auVar19,auVar15,0x96);
          auVar18 = vmovdqu64_avx512f(pauVar5[-8]);
          auVar19 = vmovdqu64_avx512f(pauVar5[-9]);
          auVar22 = vmovdqa64_avx512f(auVar18);
          auVar22 = vpternlogd_avx512f(auVar22,auVar19,auVar15,0xe8);
          auVar15 = vpternlogd_avx512f(auVar15,auVar19,auVar18,0x96);
          auVar18 = vmovdqu64_avx512f(pauVar5[-6]);
          auVar19 = vmovdqa64_avx512f(auVar22);
          auVar19 = vpternlogd_avx512f(auVar19,auVar17,auVar14,0xe8);
          auVar14 = vpternlogd_avx512f(auVar22,auVar17,auVar14,0x96);
          auVar17 = vmovdqa64_avx512f(auVar19);
          auVar17 = vpternlogd_avx512f(auVar17,auVar20,auVar12,0xe8);
          auVar12 = vpternlogd_avx512f(auVar19,auVar20,auVar12,0x96);
          auVar19 = vmovdqu64_avx512f(pauVar5[-5]);
          auVar20 = vmovdqa64_avx512f(auVar18);
          auVar20 = vpternlogd_avx512f(auVar20,auVar21,auVar15,0xe8);
          auVar15 = vpternlogd_avx512f(auVar15,auVar21,auVar18,0x96);
          auVar18 = vmovdqu64_avx512f(pauVar5[-4]);
          auVar21 = vmovdqa64_avx512f(auVar18);
          auVar21 = vpternlogd_avx512f(auVar21,auVar19,auVar15,0xe8);
          auVar15 = vpternlogd_avx512f(auVar15,auVar19,auVar18,0x96);
          auVar18 = vmovdqu64_avx512f(pauVar5[-3]);
          auVar19 = vmovdqa64_avx512f(auVar21);
          auVar19 = vpternlogd_avx512f(auVar19,auVar20,auVar14,0xe8);
          auVar14 = vpternlogd_avx512f(auVar21,auVar20,auVar14,0x96);
          auVar20 = vmovdqu64_avx512f(pauVar5[-2]);
          auVar21 = vmovdqa64_avx512f(auVar20);
          auVar21 = vpternlogd_avx512f(auVar21,auVar18,auVar15,0xe8);
          auVar18 = vpternlogd_avx512f(auVar15,auVar18,auVar20,0x96);
          auVar20 = vmovdqu64_avx512f(pauVar5[-1]);
          auVar22 = vmovdqu64_avx512f(*pauVar5);
          pauVar5 = pauVar5 + 0x10;
          auVar15 = vmovdqa64_avx512f(auVar18);
          auVar15 = vpternlogd_avx512f(auVar15,auVar20,auVar22,0x96);
          auVar18 = vpternlogd_avx512f(auVar22,auVar20,auVar18,0xe8);
          auVar20 = vmovdqa64_avx512f(auVar18);
          auVar20 = vpternlogd_avx512f(auVar20,auVar21,auVar14,0xe8);
          auVar14 = vpternlogd_avx512f(auVar18,auVar21,auVar14,0x96);
          auVar18 = vmovdqa64_avx512f(auVar20);
          auVar18 = vpternlogd_avx512f(auVar18,auVar19,auVar12,0xe8);
          auVar12 = vpternlogd_avx512f(auVar20,auVar19,auVar12,0x96);
          auVar19 = vpandq_avx512f(auVar40,auVar16);
          auVar20 = vpsrlw_avx512bw(auVar40,1);
          auVar20 = vpandq_avx512f(auVar20,auVar16);
          auVar23 = vpaddw_avx512bw(auVar23,auVar19);
          auVar19 = vpsrlw_avx512bw(auVar40,2);
          auVar21 = vpsrlw_avx512bw(auVar40,3);
          auVar38 = vpaddw_avx512bw(auVar38,auVar20);
          auVar19 = vpandq_avx512f(auVar19,auVar16);
          auVar20 = vpsrlw_avx512bw(auVar40,4);
          auVar37 = vpaddw_avx512bw(auVar37,auVar19);
          auVar19 = vpandq_avx512f(auVar21,auVar16);
          auVar21 = vpsrlw_avx512bw(auVar40,5);
          auVar36 = vpaddw_avx512bw(auVar36,auVar19);
          auVar19 = vpandq_avx512f(auVar20,auVar16);
          auVar20 = vpsrlw_avx512bw(auVar40,6);
          auVar35 = vpaddw_avx512bw(auVar35,auVar19);
          auVar19 = vpandq_avx512f(auVar21,auVar16);
          auVar21 = vpsrlw_avx512bw(auVar40,7);
          auVar34 = vpaddw_avx512bw(auVar34,auVar19);
          auVar19 = vpandq_avx512f(auVar20,auVar16);
          auVar20 = vpsrlw_avx512bw(auVar40,8);
          auVar33 = vpaddw_avx512bw(auVar33,auVar19);
          auVar19 = vpandq_avx512f(auVar21,auVar16);
          auVar21 = vpsrlw_avx512bw(auVar40,9);
          auVar32 = vpaddw_avx512bw(auVar32,auVar19);
          auVar19 = vpandq_avx512f(auVar20,auVar16);
          auVar20 = vpsrlw_avx512bw(auVar40,10);
          auVar31 = vpaddw_avx512bw(auVar31,auVar19);
          auVar19 = vpandq_avx512f(auVar21,auVar16);
          auVar21 = vpsrlw_avx512bw(auVar40,0xb);
          auVar30 = vpaddw_avx512bw(auVar30,auVar19);
          auVar19 = vpandq_avx512f(auVar20,auVar16);
          auVar20 = vpsrlw_avx512bw(auVar40,0xc);
          auVar29 = vpaddw_avx512bw(auVar29,auVar19);
          auVar19 = vpandq_avx512f(auVar21,auVar16);
          auVar21 = vpsrlw_avx512bw(auVar40,0xd);
          auVar28 = vpaddw_avx512bw(auVar28,auVar19);
          auVar19 = vpandq_avx512f(auVar20,auVar16);
          auVar20 = vpsrlw_avx512bw(auVar40,0xe);
          auVar27 = vpaddw_avx512bw(auVar27,auVar19);
          auVar19 = vpandq_avx512f(auVar21,auVar16);
          auVar21 = vpsrlw_avx512bw(auVar40,0xf);
          auVar40 = vmovdqa64_avx512f(auVar18);
          auVar40 = vpternlogd_avx512f(auVar40,auVar17,auVar13,0xe8);
          auVar13 = vpternlogd_avx512f(auVar18,auVar17,auVar13,0x96);
          auVar26 = vpaddw_avx512bw(auVar26,auVar19);
          auVar17 = vpandq_avx512f(auVar20,auVar16);
          auVar24 = vpaddw_avx512bw(auVar24,auVar21);
          auVar25 = vpaddw_avx512bw(auVar25,auVar17);
        } while (uVar6 < uVar3);
        local_440 = vmovdqa64_avx512f(auVar38);
        local_400 = vmovdqa64_avx512f(auVar37);
        local_3c0 = vmovdqa64_avx512f(auVar36);
        local_380 = vmovdqa64_avx512f(auVar35);
        local_340 = vmovdqa64_avx512f(auVar34);
        local_300 = vmovdqa64_avx512f(auVar33);
        local_2c0 = vmovdqa64_avx512f(auVar32);
        local_280 = vmovdqa64_avx512f(auVar31);
        local_240 = vmovdqa64_avx512f(auVar30);
        local_200 = vmovdqa64_avx512f(auVar29);
        local_1c0 = vmovdqa64_avx512f(auVar28);
        local_180 = vmovdqa64_avx512f(auVar27);
        local_140 = vmovdqa64_avx512f(auVar26);
        local_100 = vmovdqa64_avx512f(auVar25);
        local_c0 = vmovdqa64_avx512f(auVar24);
      }
      else {
        auVar12 = vmovdqa64_avx512f(auVar12);
        auVar16 = vpbroadcastw_avx512bw(ZEXT216(1));
        auVar40 = vmovdqa64_avx512f(auVar40);
        auVar13 = vmovdqa64_avx512f(auVar13);
        auVar14 = vmovdqa64_avx512f(auVar14);
        auVar15 = vmovdqa64_avx512f(auVar15);
        auVar23 = ZEXT1664((undefined1  [16])0x0);
      }
      auVar38 = vmovdqa64_avx512f(_DAT_001176c0);
      auVar37 = vmovdqa64_avx512f(_DAT_00117700);
      lVar2 = 0;
      local_480 = vmovdqa64_avx512f(auVar23);
      do {
        auVar23 = vpandq_avx512f(auVar40,auVar16);
        auVar23 = vpaddw_avx512bw(auVar23,*(undefined1 (*) [64])(local_480 + lVar2));
        auVar40 = vpsrlw_avx512bw(auVar40,1);
        auVar23 = vmovdqa64_avx512f(auVar23);
        *(undefined1 (*) [64])(local_480 + lVar2) = auVar23;
        lVar2 = lVar2 + 0x40;
      } while (lVar2 != 0x400);
      uVar3 = 0xfffffffffffffffe;
      pauVar5 = &local_440;
      do {
        auVar16 = vmovdqa64_avx512f(pauVar5[-1]);
        auVar23 = vmovdqa64_avx512f(*pauVar5);
        pauVar5 = pauVar5 + 2;
        auVar36 = vmovdqa64_avx512f(auVar16);
        auVar16 = vpermt2b_avx512_vbmi(auVar16,auVar37,auVar23);
        auVar23 = vpermt2b_avx512_vbmi(auVar36,auVar38,auVar23);
        auVar16 = vpsadbw_avx512bw(auVar16,ZEXT1664((undefined1  [16])0x0));
        auVar23 = vpsadbw_avx512bw(auVar23,ZEXT1664((undefined1  [16])0x0));
        auVar16 = vpsllq_avx512f(auVar16,8);
        auVar16 = vpaddq_avx512f(auVar16,auVar23);
        auVar16 = vpslld_avx512f(auVar16,4);
        auVar9 = vextracti32x4_avx512f(auVar16,2);
        auVar11 = vextracti64x4_avx512f(auVar16,1);
        auVar10 = vpunpcklqdq_avx(auVar16._0_16_,auVar9);
        auVar9 = vpunpckhqdq_avx(auVar16._0_16_,auVar11._0_16_);
        auVar9 = vpaddq_avx(auVar10,auVar9);
        auVar1 = vpunpcklqdq_avx2(auVar16._0_32_,auVar11);
        auVar11 = vpunpckhqdq_avx2(auVar16._0_32_,auVar11);
        auVar9 = vpaddq_avx(auVar9,auVar1._16_16_);
        auVar9 = vpaddq_avx(auVar9,auVar11._16_16_);
        auVar9 = vpshufd_avx(auVar9,0xe8);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *(ulong *)(flags + uVar3 + 2);
        auVar9 = vpaddd_avx(auVar10,auVar9);
        *(long *)(flags + uVar3 + 2) = auVar9._0_8_;
        uVar3 = uVar3 + 2;
      } while (uVar3 < 0xe);
    } while (uVar6 < uVar4);
  }
  vmovdqu64_avx512f(auVar15);
  auVar15 = vpmovsxbd_avx512f(_DAT_00116080);
  auVar40 = vpbroadcastd_avx512f(ZEXT416(1));
  lVar2 = 0;
  auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar2 = lVar2 + 1;
    auVar23 = vpbroadcastd_avx512f();
    auVar23 = vpsrlvd_avx512f(auVar23,auVar15);
    auVar23 = vpandd_avx512f(auVar23,auVar40);
    auVar16 = vpaddd_avx512f(auVar23,auVar16);
  } while (lVar2 != 0x20);
  auVar40 = vmovdqu64_avx512f(auVar16);
  *(undefined1 (*) [64])flags = auVar40;
  vmovdqu64_avx512f(auVar14);
  auVar14 = vpbroadcastd_avx512f(ZEXT416(2));
  lVar2 = 0;
  auVar40 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar2 = lVar2 + 1;
    auVar16 = vpbroadcastd_avx512f();
    auVar16 = vpsrlvd_avx512f(auVar16,auVar15);
    auVar16 = vpaddd_avx512f(auVar16,auVar16);
    auVar16 = vpandd_avx512f(auVar16,auVar14);
    auVar40 = vpaddd_avx512f(auVar16,auVar40);
  } while (lVar2 != 0x20);
  auVar14 = vmovdqu64_avx512f(auVar40);
  *(undefined1 (*) [64])flags = auVar14;
  vmovdqu64_avx512f(auVar12);
  auVar12 = vpbroadcastd_avx512f(ZEXT416(4));
  lVar2 = 0;
  auVar14 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar2 = lVar2 + 1;
    auVar40 = vpbroadcastd_avx512f();
    auVar40 = vpsrlvd_avx512f(auVar40,auVar15);
    auVar40 = vpslld_avx512f(auVar40,2);
    auVar40 = vpandd_avx512f(auVar40,auVar12);
    auVar14 = vpaddd_avx512f(auVar40,auVar14);
  } while (lVar2 != 0x20);
  auVar12 = vmovdqu64_avx512f(auVar14);
  *(undefined1 (*) [64])flags = auVar12;
  vmovdqu64_avx512f(auVar13);
  auVar12 = vpbroadcastd_avx512f(ZEXT416(8));
  lVar2 = 0;
  auVar13 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
  do {
    lVar2 = lVar2 + 1;
    auVar14 = vpbroadcastd_avx512f();
    auVar14 = vpsrlvd_avx512f(auVar14,auVar15);
    auVar14 = vpslld_avx512f(auVar14,3);
    auVar14 = vpandd_avx512f(auVar14,auVar12);
    auVar13 = vpaddd_avx512f(auVar14,auVar13);
  } while (lVar2 != 0x20);
  auVar12 = vmovdqu64_avx512f(auVar13);
  *(undefined1 (*) [64])flags = auVar12;
  return 0;
}

Assistant:

int pospopcnt_u16_avx512vbmi_harley_seal(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (32 * 16)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m512i* data = (const __m512i*)array;
    __m512i v1  = _mm512_setzero_si512();
    __m512i v2  = _mm512_setzero_si512();
    __m512i v4  = _mm512_setzero_si512();
    __m512i v8  = _mm512_setzero_si512();
    __m512i v16 = _mm512_setzero_si512();
    __m512i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const size_t size = len / 32;
    const uint64_t limit = size - size % 16;

    uint16_t buffer[32];

    uint64_t i = 0;
    while (i < limit) {
        __m512i counter[16];
        for (size_t i = 0; i < 16; ++i) {
            counter[i] = _mm512_setzero_si512();
        }

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define U(pos) {                     \
    counter[pos] = _mm512_add_epi16(counter[pos], _mm512_and_si512(v16, _mm512_set1_epi16(1))); \
    v16 = _mm512_srli_epi16(v16, 1); \
}
            pospopcnt_csa_avx512(&twosA,  &v1, _mm512_loadu_si512(data + i + 0), _mm512_loadu_si512(data + i + 1));
            pospopcnt_csa_avx512(&twosB,  &v1, _mm512_loadu_si512(data + i + 2), _mm512_loadu_si512(data + i + 3));
            pospopcnt_csa_avx512(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_avx512(&twosA,  &v1, _mm512_loadu_si512(data + i + 4), _mm512_loadu_si512(data + i + 5));
            pospopcnt_csa_avx512(&twosB,  &v1, _mm512_loadu_si512(data + i + 6), _mm512_loadu_si512(data + i + 7));
            pospopcnt_csa_avx512(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_avx512(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_avx512(&twosA,  &v1, _mm512_loadu_si512(data + i + 8),  _mm512_loadu_si512(data + i + 9));
            pospopcnt_csa_avx512(&twosB,  &v1, _mm512_loadu_si512(data + i + 10), _mm512_loadu_si512(data + i + 11));
            pospopcnt_csa_avx512(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_avx512(&twosA,  &v1, _mm512_loadu_si512(data + i + 12), _mm512_loadu_si512(data + i + 13));
            pospopcnt_csa_avx512(&twosB,  &v1, _mm512_loadu_si512(data + i + 14), _mm512_loadu_si512(data + i + 15));
            pospopcnt_csa_avx512(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_avx512(&eightsB,&v4, foursA, foursB);
            U(0) U(1) U(2) U(3) U(4) U(5) U(6) U(7) U(8) U(9) U(10) U(11) U(12) U(13) U(14) U(15) // Updates
            pospopcnt_csa_avx512(&v16,    &v8, eightsA, eightsB);
        }

        // Update the counters after the last iteration
        for (size_t i = 0; i < 16; ++i) U(i)
#undef U
        
        for (size_t i = 0; i < 16; i += 2) {
// 00000110 00000100 00000010 00000000, 00001110 00001100 00001010 00001000, 00010110 00010100 00010010 00010000, 00011110 00011100 00011010 00011000
// {6, 4, 2, 0},                        {14, 12, 10, 8},                     {22, 20, 18, 16},                    {30, 28, 26, 24}
// 00100110 00100100 00100010 00100000, 00101110 00101100 00101010 00101000, 00110110 00110100 00110010 00110000, 00111110 00111100 00111010 00111000
// {38, 36, 34, 32},                    {46, 44, 42, 40},                    {54, 52, 50, 48},                    {62, 60, 58, 56}
// 01000110 01000100 01000010 01000000, 01001110 01001100 01001010 01001000, 01010110 01010100 01010010 01010000, 01011110 01011100 01011010 01011000
// {70, 68, 66, 64},                    {78, 76, 74, 72},                    {86, 84, 82, 80},                    {94, 92, 90, 88}
// 01100110 01100100 01100010 01100000, 01101110 01101100 01101010 01101000, 01110110 01110100 01110010 01110000, 01111110 01111100 01111010 01111000
// {102, 100, 98, 96},                  {110, 108, 106, 104},                {118, 116, 114, 112},                {126, 124, 122, 120}
            __m512i shuffle_lo = _mm512_setr_epi32(0x06040200, 0x0e0c0a08, 0x16141210, 0x1e1c1a18,
                                                   0x26242220, 0x2e2c2a28, 0x36343230, 0x3e3c3a38,
                                                   0x46444240, 0x4e4c4a48, 0x56545250, 0x5e5c5a58,
                                                   0x66646260, 0x6e6c6a68, 0x76747270, 0x7e7c7a78);

// 00000111 00000101 00000011 00000001, 00001111 00001101 00001011 00001001, 00010111 00010101 00010011 00010001, 00011111 00011101 00011011 00011001
// {7, 5, 3, 1},                        {15, 13, 11, 9},                     {23, 21, 19, 17},                    {31, 29, 27, 25}
// 00100111 00100101 00100011 00100001, 00101111 00101101 00101011 00101001, 00110111 00110101 00110011 00110001, 00111111 00111101 00111011 00111001
// {39, 37, 35, 33},                    {47, 45, 43, 41},                    {55, 53, 51, 49},                    {63, 61, 59, 57}
// 01000111 01000101 01000011 01000001, 01001111 01001101 01001011 01001001, 01010111 01010101 01010011 01010001, 01011111 01011101 01011011 01011001
// {71, 69, 67, 65},                    {79, 77, 75, 73},                    {87, 85, 83, 81},                    {95, 93, 91, 89}
// 01100111 01100101 01100011 01100001, 01101111 01101101 01101011 01101001, 01110111 01110101 01110011 01110001, 01111111 01111101 01111011 01111001
 // {103, 101, 99, 97},                 {111, 109, 107, 105},                {119, 117, 115, 113},                {127, 125, 123, 121}
            __m512i shuffle_hi = _mm512_setr_epi32(0x07050301, 0x0f0d0b09, 0x17151311, 0x1f1d1b19,
                                                   0x27252321, 0x2f2d2b29, 0x37353331, 0x3f3d3b39,
                                                   0x47454341, 0x4f4d4b49, 0x57555351, 0x5f5d5b59,
                                                   0x67656361, 0x6f6d6b69, 0x77757371, 0x7f7d7b79);
            
            // Move **lower** bytes from 16-bit counters, so bytes 0..31 of
            // results are from counter[i] and 32..63 from counter[i+1].
            __m512i lo_bytes = _mm512_permutex2var_epi8(counter[i], shuffle_lo, counter[i + 1]);

            // Likewise, move **higher** bytes.
            __m512i hi_bytes = _mm512_permutex2var_epi8(counter[i], shuffle_hi, counter[i + 1]);

            // Sum the lower bytes: now each 64-bit word holds sum of 8 bytes.
            __m512i sum_lo = _mm512_sad_epu8(lo_bytes, _mm512_setzero_si512());

            // Likewise sum the higher bytes.
            __m512i sum_hi = _mm512_sad_epu8(hi_bytes, _mm512_setzero_si512());

            // Calculate final sums --- the sum of higher bytes has to be multiplied by 256 (1 << 8)
            __m512i sum = _mm512_add_epi64(sum_lo, _mm512_slli_epi64(sum_hi, 8));

            // Since _mm512_extract* are slow. Instead we use a local buffer that is most likely cached.
            uint64_t buf64[8];
            _mm512_storeu_si512((__m512i*)buf64, _mm512_slli_epi32(sum, 4));

            flags[i + 0] += buf64[0] + buf64[1] + buf64[2] + buf64[3];
            flags[i + 1] += buf64[4] + buf64[5] + buf64[6] + buf64[7];
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v1);
    for (size_t i = 0; i < 32; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 1 * ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v2);
    for (size_t i = 0; i < 32; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    
    _mm512_storeu_si512((__m512i*)buffer, v4);
    for (size_t i = 0; i < 32; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm512_storeu_si512((__m512i*)buffer, v8);
    for (size_t i = 0; i < 32; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}